

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_diag_sse41_128_8.c
# Opt level: O2

void arr_store_si128(int *array,__m128i vH,int32_t t,int32_t seglen,int32_t d,int32_t dlen)

{
  ulong uVar1;
  long lVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  
  uVar1 = (ulong)(uint)seglen;
  lVar2 = (long)t;
  array[uVar1 * (long)(int)vH[0] + lVar2] = (int)(char)in_XMM0_Qa;
  array[(long)((int)vH[1] + (int)vH[0]) * uVar1 + lVar2] = (int)(char)((ulong)in_XMM0_Qa >> 8);
  array[(long)((int)vH[0] + (int)vH[1] * 2) * uVar1 + lVar2] =
       (int)(char)((ulong)in_XMM0_Qa >> 0x10);
  array[(long)((int)vH[1] * 3 + (int)vH[0]) * uVar1 + lVar2] =
       (int)(char)((ulong)in_XMM0_Qa >> 0x18);
  array[(long)((int)vH[0] + (int)vH[1] * 4) * uVar1 + lVar2] =
       (int)(char)((ulong)in_XMM0_Qa >> 0x20);
  array[(long)((int)vH[1] * 5 + (int)vH[0]) * uVar1 + lVar2] =
       (int)(char)((ulong)in_XMM0_Qa >> 0x28);
  array[(long)((int)vH[1] * 6 + (int)vH[0]) * uVar1 + lVar2] =
       (int)(char)((ulong)in_XMM0_Qa >> 0x30);
  array[(long)((int)vH[1] * 7 + (int)vH[0]) * uVar1 + lVar2] =
       (int)(char)((ulong)in_XMM0_Qa >> 0x38);
  array[(long)((int)vH[0] + (int)vH[1] * 8) * uVar1 + lVar2] = (int)(char)in_XMM0_Qb;
  array[(long)((int)vH[1] * 9 + (int)vH[0]) * uVar1 + lVar2] = (int)(char)((ulong)in_XMM0_Qb >> 8);
  array[(long)((int)vH[1] * 10 + (int)vH[0]) * uVar1 + lVar2] =
       (int)(char)((ulong)in_XMM0_Qb >> 0x10);
  array[(long)((int)vH[1] * 0xb + (int)vH[0]) * uVar1 + lVar2] =
       (int)(char)((ulong)in_XMM0_Qb >> 0x18);
  array[(long)((int)vH[1] * 0xc + (int)vH[0]) * uVar1 + lVar2] =
       (int)(char)((ulong)in_XMM0_Qb >> 0x20);
  array[(long)((int)vH[1] * 0xd + (int)vH[0]) * uVar1 + lVar2] =
       (int)(char)((ulong)in_XMM0_Qb >> 0x28);
  array[(long)((int)vH[1] * 0xe + (int)vH[0]) * uVar1 + lVar2] =
       (int)(char)((ulong)in_XMM0_Qb >> 0x30);
  array[(long)((int)vH[1] * 0xf + (int)vH[0]) * uVar1 + lVar2] =
       (int)(char)((ulong)in_XMM0_Qb >> 0x38);
  return;
}

Assistant:

static inline void arr_store_si128(
        int *array,
        __m128i vWH,
        int32_t i,
        int32_t s1Len,
        int32_t j,
        int32_t s2Len)
{
    if (0 <= i+0 && i+0 < s1Len && 0 <= j-0 && j-0 < s2Len) {
        array[1LL*(i+0)*s2Len + (j-0)] = (int8_t)_mm_extract_epi8(vWH, 15);
    }
    if (0 <= i+1 && i+1 < s1Len && 0 <= j-1 && j-1 < s2Len) {
        array[1LL*(i+1)*s2Len + (j-1)] = (int8_t)_mm_extract_epi8(vWH, 14);
    }
    if (0 <= i+2 && i+2 < s1Len && 0 <= j-2 && j-2 < s2Len) {
        array[1LL*(i+2)*s2Len + (j-2)] = (int8_t)_mm_extract_epi8(vWH, 13);
    }
    if (0 <= i+3 && i+3 < s1Len && 0 <= j-3 && j-3 < s2Len) {
        array[1LL*(i+3)*s2Len + (j-3)] = (int8_t)_mm_extract_epi8(vWH, 12);
    }
    if (0 <= i+4 && i+4 < s1Len && 0 <= j-4 && j-4 < s2Len) {
        array[1LL*(i+4)*s2Len + (j-4)] = (int8_t)_mm_extract_epi8(vWH, 11);
    }
    if (0 <= i+5 && i+5 < s1Len && 0 <= j-5 && j-5 < s2Len) {
        array[1LL*(i+5)*s2Len + (j-5)] = (int8_t)_mm_extract_epi8(vWH, 10);
    }
    if (0 <= i+6 && i+6 < s1Len && 0 <= j-6 && j-6 < s2Len) {
        array[1LL*(i+6)*s2Len + (j-6)] = (int8_t)_mm_extract_epi8(vWH, 9);
    }
    if (0 <= i+7 && i+7 < s1Len && 0 <= j-7 && j-7 < s2Len) {
        array[1LL*(i+7)*s2Len + (j-7)] = (int8_t)_mm_extract_epi8(vWH, 8);
    }
    if (0 <= i+8 && i+8 < s1Len && 0 <= j-8 && j-8 < s2Len) {
        array[1LL*(i+8)*s2Len + (j-8)] = (int8_t)_mm_extract_epi8(vWH, 7);
    }
    if (0 <= i+9 && i+9 < s1Len && 0 <= j-9 && j-9 < s2Len) {
        array[1LL*(i+9)*s2Len + (j-9)] = (int8_t)_mm_extract_epi8(vWH, 6);
    }
    if (0 <= i+10 && i+10 < s1Len && 0 <= j-10 && j-10 < s2Len) {
        array[1LL*(i+10)*s2Len + (j-10)] = (int8_t)_mm_extract_epi8(vWH, 5);
    }
    if (0 <= i+11 && i+11 < s1Len && 0 <= j-11 && j-11 < s2Len) {
        array[1LL*(i+11)*s2Len + (j-11)] = (int8_t)_mm_extract_epi8(vWH, 4);
    }
    if (0 <= i+12 && i+12 < s1Len && 0 <= j-12 && j-12 < s2Len) {
        array[1LL*(i+12)*s2Len + (j-12)] = (int8_t)_mm_extract_epi8(vWH, 3);
    }
    if (0 <= i+13 && i+13 < s1Len && 0 <= j-13 && j-13 < s2Len) {
        array[1LL*(i+13)*s2Len + (j-13)] = (int8_t)_mm_extract_epi8(vWH, 2);
    }
    if (0 <= i+14 && i+14 < s1Len && 0 <= j-14 && j-14 < s2Len) {
        array[1LL*(i+14)*s2Len + (j-14)] = (int8_t)_mm_extract_epi8(vWH, 1);
    }
    if (0 <= i+15 && i+15 < s1Len && 0 <= j-15 && j-15 < s2Len) {
        array[1LL*(i+15)*s2Len + (j-15)] = (int8_t)_mm_extract_epi8(vWH, 0);
    }
}